

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O2

void __thiscall Z80::OpCode_Next_MIRROR(Z80 *this)

{
  Z80Reg ZVar1;
  char *badValueMessage;
  char *message;
  EStatus EStack_10;
  
  if (DAT_0018a51c < 1) {
    message = "Z80N instructions are currently disabled";
    EStack_10 = SUPPRESS;
    badValueMessage = bp;
  }
  else {
    ZVar1 = GetRegister((char **)this);
    if ((ZVar1 == Z80_UNK) || (ZVar1 == Z80_A)) {
      EmitByte(0xed,true);
      EmitByte(0x24,false);
      return;
    }
    message = "[MIRROR] Illegal operand (can be only register A)";
    EStack_10 = PASS3;
    badValueMessage = ::line;
  }
  Error(message,badValueMessage,EStack_10);
  return;
}

Assistant:

static void OpCode_Next_MIRROR() {
		if (Options::syx.IsNextEnabled < 1) {
			Error("Z80N instructions are currently disabled", bp, SUPPRESS);
			return;
		}
		Z80Reg reg = GetRegister(lp);
		if (Z80_UNK != reg && Z80_A != reg) {
			Error("[MIRROR] Illegal operand (can be only register A)", line);
			return;
		}
		EmitByte(0xED, true);
		EmitByte(0x24);
	}